

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O2

CTcSymProp * __thiscall
CTcGramAltFuncsDyn::look_up_prop(CTcGramAltFuncsDyn *this,CTcToken *tok,int show_err)

{
  CTcSymProp *pCVar1;
  int errnum;
  
  pCVar1 = (CTcSymProp *)CTcPrsSymtab::find(this->symtab,tok->text_,tok->text_len_);
  if (pCVar1 == (CTcSymProp *)0x0) {
    errnum = 0x2b18;
  }
  else {
    if (*(int *)&((CVmHashEntry *)
                 &(pCVar1->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase)->field_0x24 ==
        3) {
      return pCVar1;
    }
    errnum = 0x2b63;
  }
  if (show_err != 0) {
    CTcTokenizer::log_error(errnum,(ulong)(uint)tok->text_len_,tok->text_);
  }
  return (CTcSymProp *)0x0;
}

Assistant:

CTcSymProp *look_up_prop(const CTcToken *tok, int show_err)
    {
        /* look up the symbol */
        CTcSymProp *prop = (CTcSymProp *)symtab->find(
            tok->get_text(), tok->get_text_len());

        /* if it's already defined, make sure it's a property */
        if (prop != 0)
        {
            /* make sure it's a property */
            if (prop->get_type() != TC_SYM_PROP)
            {
                /* log an error if appropriate */
                if (show_err)
                {
                    G_tok->log_error(
                        TCERR_REDEF_AS_PROP,
                        (int)tok->get_text_len(), tok->get_text());
                }

                /* we can't use the symbol, so forget it */
                prop = 0;
            }
        }
        else
        {
            /* 
             *   undefined - we can't add it for dynamic compilation, so log
             *   an error 
             */
            if (show_err)
            {
                G_tok->log_error(
                    TCERR_UNDEF_SYM,
                    (int)tok->get_text_len(), tok->get_text());
            }
        }

        /* return the property */
        return prop;
    }